

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_to_constructor.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  element_type *peVar2;
  shared<boost::ext::di::v1_3_0::scopes::singleton,_example,_std::shared_ptr<example>_&> sVar3;
  i injector;
  scope_impl<example,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> local_41;
  provider<boost::ext::di::v1_3_0::aux::pair<example,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  
  local_38._0_4_ = 0x2a;
  local_30 = (undefined1 *)0x4055c00000000000;
  local_40.injector_ =
       (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
        *)&local_38;
  sVar3 = boost::ext::di::v1_3_0::scopes::singleton::
          scope_impl<example,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
          create_impl<example,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<example,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>>>>
                    (&local_41,
                     (provider<boost::ext::di::v1_3_0::aux::pair<example,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
                      *)&local_40);
  peVar2 = ((sVar3.object)->super___shared_ptr<example,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->i != 0x2a) {
    __assert_fail("42 == object.ex.i",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x24,"int main()");
  }
  dVar1 = peVar2->d;
  if ((dVar1 != 87.0) || (NAN(dVar1))) {
    __assert_fail("87.0 == object.ex.d",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x25,"int main()");
  }
  local_38._0_4_ = 0x2a;
  local_30 = (undefined1 *)0x4055c00000000000;
  local_40.injector_ =
       (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
        *)&local_38;
  sVar3 = boost::ext::di::v1_3_0::scopes::singleton::
          scope_impl<example,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
          create_impl<example,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<example,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>>>>
                    (&local_41,
                     (provider<boost::ext::di::v1_3_0::aux::pair<example,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
                      *)&local_40);
  peVar2 = ((sVar3.object)->super___shared_ptr<example,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->i != 0x2a) {
    __assert_fail("42 == object.ex.i",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x32,"int main()");
  }
  dVar1 = peVar2->d;
  if ((dVar1 != 87.0) || (NAN(dVar1))) {
    __assert_fail("87.0 == object.ex.d",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x33,"int main()");
  }
  local_38 = (undefined1 *)CONCAT44(local_38._4_4_,0x2a);
  local_30 = &boost::ext::di::v1_3_0::placeholders::_;
  local_28 = 0x4055c00000000000;
  local_40.injector_ =
       (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
        *)&local_38;
  sVar3 = boost::ext::di::v1_3_0::scopes::singleton::
          scope_impl<example,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
          create_impl<example,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<example,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,boost::ext::di::v1_3_0::placeholders::arg_const&>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,boost::ext::di::v1_3_0::placeholders::arg_const&>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,double,double,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
                    (&local_41,&local_40);
  peVar2 = ((sVar3.object)->super___shared_ptr<example,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->i != 0x2a) {
    __assert_fail("42 == object.ex.i",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x41,"int main()");
  }
  dVar1 = peVar2->d;
  if ((dVar1 != 87.0) || (NAN(dVar1))) {
    __assert_fail("87.0 == object.ex.d",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x42,"int main()");
  }
  local_38 = &boost::ext::di::v1_3_0::placeholders::_;
  local_30 = (undefined1 *)0x4055c00000000000;
  local_28 = CONCAT44(local_28._4_4_,0x2a);
  local_40.injector_ =
       (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
        *)&local_38;
  sVar3 = boost::ext::di::v1_3_0::scopes::singleton::
          scope_impl<example,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
          create_impl<example,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<example,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,boost::ext::di::v1_3_0::placeholders::arg_const&>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,boost::ext::di::v1_3_0::placeholders::arg_const&>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
                    (&local_41,
                     (provider<boost::ext::di::v1_3_0::aux::pair<example,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
                      *)&local_40);
  peVar2 = ((sVar3.object)->super___shared_ptr<example,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->i != 0x2a) {
    __assert_fail("42 == object.ex.i",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x4f,"int main()");
  }
  dVar1 = peVar2->d;
  if ((dVar1 == 87.0) && (!NAN(dVar1))) {
    return 0;
  }
  __assert_fail("87.0 == object.ex.d",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                ,0x50,"int main()");
}

Assistant:

int main() {
  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>()(42, 87.0) // or di::bind<example>().to<example>(42, 87.0)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }

#if defined(__cpp_variable_templates)
  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>(42, 87.0)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }
#endif

  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>()(42, di::placeholders::_), // inject second argument
      di::bind<>().to(87.0)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }

  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>()(di::placeholders::_, 87.0), // inject first argument
      di::bind<>().to(42)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }
}